

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,false,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  interval_t upper;
  interval_t input;
  interval_t lower;
  bool bVar1;
  int64_t unaff_RBX;
  ulong uVar2;
  undefined8 unaff_R12;
  int64_t unaff_R13;
  idx_t i;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = uVar3;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)result_sel->sel_vector[uVar3];
    }
    input.micros = unaff_RBX;
    input._0_8_ = asel;
    lower.micros = unaff_R13;
    lower.months = (int)unaff_R12;
    lower.days = (int)((ulong)unaff_R12 >> 0x20);
    upper.micros = (int64_t)result_sel;
    upper.months = (int)count;
    upper.days = (int)(count >> 0x20);
    bVar1 = LowerInclusiveBetweenOperator::Operation<duckdb::interval_t>(input,lower,upper);
    false_sel->sel_vector[lVar4] = (sel_t)uVar2;
    lVar4 = lVar4 + (ulong)!bVar1;
  }
  return count - lVar4;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}